

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O0

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,string *engineType,string *hostLanguage)

{
  string *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  string *in_RDI;
  string *in_R8;
  Stream *unaff_retaddr;
  string local_80 [48];
  string local_50 [40];
  string *hostLanguage_00;
  string *engineType_00;
  undefined4 in_stack_ffffffffffffffe8;
  Mode mode_00;
  
  mode_00 = (Mode)((ulong)in_RSI >> 0x20);
  hostLanguage_00 = in_R8;
  engineType_00 = in_RCX;
  helper::CommDummy();
  std::__cxx11::string::string(local_50,(string *)in_RCX);
  std::__cxx11::string::string(local_80,(string *)in_R8);
  Stream(unaff_retaddr,in_RDI,mode_00,(Comm *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
         engineType_00,hostLanguage_00);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_50);
  helper::Comm::~Comm((Comm *)0x901929);
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, const std::string engineType,
               const std::string hostLanguage)
: Stream(name, mode, helper::CommDummy(), engineType, hostLanguage)
{
}